

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cxx
# Opt level: O0

void __thiscall libcalc::Tokenizer::Tokenizer(Tokenizer *this,string *expression)

{
  string local_38 [32];
  string *local_18;
  string *expression_local;
  Tokenizer *this_local;
  
  local_18 = expression;
  expression_local = (string *)this;
  std::vector<libcalc::Token_*,_std::allocator<libcalc::Token_*>_>::vector(&this->tokens);
  std::__cxx11::string::string(local_38,(string *)expression);
  parse(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

Tokenizer::Tokenizer(std::string expression) {
  parse(expression);
}